

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionContext.cxx
# Opt level: O0

void __thiscall
cmGeneratorExpressionContext::cmGeneratorExpressionContext
          (cmGeneratorExpressionContext *this,cmMakefile *mf,string *config,bool quiet,
          cmTarget *headTarget,cmTarget *currentTarget,bool evaluateForBuildsystem,
          cmListFileBacktrace *backtrace,string *language)

{
  bool evaluateForBuildsystem_local;
  cmTarget *currentTarget_local;
  cmTarget *headTarget_local;
  bool quiet_local;
  string *config_local;
  cmMakefile *mf_local;
  cmGeneratorExpressionContext *this_local;
  
  cmListFileBacktrace::cmListFileBacktrace(&this->Backtrace,backtrace);
  std::set<cmTarget_*,_std::less<cmTarget_*>,_std::allocator<cmTarget_*>_>::set
            (&this->DependTargets);
  std::set<const_cmTarget_*,_std::less<const_cmTarget_*>,_std::allocator<const_cmTarget_*>_>::set
            (&this->AllTargets);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->SeenTargetProperties);
  std::set<const_cmTarget_*,_std::less<const_cmTarget_*>,_std::allocator<const_cmTarget_*>_>::set
            (&this->SourceSensitiveTargets);
  std::
  map<const_cmTarget_*,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<const_cmTarget_*>,_std::allocator<std::pair<const_cmTarget_*const,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  ::map(&this->MaxLanguageStandard);
  this->Makefile = mf;
  std::__cxx11::string::string((string *)&this->Config,(string *)config);
  std::__cxx11::string::string((string *)&this->Language,(string *)language);
  this->HeadTarget = headTarget;
  this->CurrentTarget = currentTarget;
  this->Quiet = quiet;
  this->HadError = false;
  this->HadContextSensitiveCondition = false;
  this->HadHeadSensitiveCondition = false;
  this->EvaluateForBuildsystem = evaluateForBuildsystem;
  return;
}

Assistant:

cmGeneratorExpressionContext::cmGeneratorExpressionContext(
      cmMakefile* mf, std::string const& config,
      bool quiet, cmTarget const* headTarget,
      cmTarget const* currentTarget,
      bool evaluateForBuildsystem,
      cmListFileBacktrace const& backtrace,
      std::string const& language)
  : Backtrace(backtrace),
    Makefile(mf),
    Config(config),
    Language(language),
    HeadTarget(headTarget),
    CurrentTarget(currentTarget),
    Quiet(quiet),
    HadError(false),
    HadContextSensitiveCondition(false),
    HadHeadSensitiveCondition(false),
    EvaluateForBuildsystem(evaluateForBuildsystem)
{
}